

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

int __thiscall Directory::open(Directory *this,char *__file,int __oflag,...)

{
  int iVar1;
  int *piVar2;
  char *__name;
  DIR *pDVar3;
  bool in_CL;
  
  if (this->dp == (void *)0x0) {
    this->dirsOnly = in_CL;
    String::operator=(&this->dirpath,(String *)__file);
    String::operator=(&this->pattern,___oflag);
    if (*(long *)(*(long *)__file + 8) == 0) {
      __name = ".";
    }
    else {
      __name = String::operator_cast_to_char_((String *)__file);
    }
    pDVar3 = opendir(__name);
    this->dp = pDVar3;
    iVar1 = (int)CONCAT71((int7)((ulong)pDVar3 >> 8),pDVar3 != (DIR *)0x0);
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

bool Directory::open(const String& dirpath, const String& pattern, bool dirsOnly)
{
#ifdef _WIN32
  if(findFile != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }

  this->dirsOnly = dirsOnly;
  this->dirpath = dirpath;

  // there are three FindFirstFile/FindFirstFileEx issues:
  // 1) '?' does not match exacty 1 character but also 0 characters.
  // 2) pattern machting on file extensions is kinda funky. (*.aaa matches x.aaabb, *a.* matches aa, a?t does not match a.t)
  // 3) it is hard to differentiate between nonexistent directories and directories in which no matching files can be found.

  // solutions:
  // 1) when pattern contains an '?', test if results really match
  // 2) replace '?' with '*', when pattern ends with '.*' or does not end with '*', test if results really match
  // 3) when FindFirstFileEx results in an invalid handle, then try again using '*' as pattern and test if results really match (probably they don't)

  String searchPat = pattern;
  this->pattern.clear();
  if(searchPat.find('?'))
  {
    this->pattern = pattern;
    searchPat.replace('?', '*');
  }
  else if(!pattern.isEmpty() && (pattern[pattern.length() - 1] != '*' || (pattern.length() > 1 && pattern[pattern.length() - 2] == '.')))
    this->pattern = pattern;
  if(searchPat.isEmpty())
    searchPat = "*";

  String searchStr = dirpath;
  searchStr.reserve(dirpath.length() + 1 + pattern.length());
  if(!dirpath.isEmpty())
    searchStr.append('/');
  usize searchStrLen = searchStr.length();
  searchStr.append(searchPat);

  findFile = FindFirstFileEx(searchStr,
#if _WIN32_WINNT > 0x0600
    FindExInfoBasic,
#else
    FindExInfoStandard,
#endif
    (LPWIN32_FIND_DATA)ffd, dirsOnly ? FindExSearchLimitToDirectories : FindExSearchNameMatch, NULL, 0);
  if(findFile == INVALID_HANDLE_VALUE)
  {
    if(searchPat == "*")
      return false;
    this->pattern = pattern;
    searchStr.resize(searchStrLen);
    searchStr.append("*");
    findFile = FindFirstFileEx(searchStr,
  #if _WIN32_WINNT > 0x0600
      FindExInfoBasic,
  #else
      FindExInfoStandard,
  #endif
      (LPWIN32_FIND_DATA)ffd, dirsOnly ? FindExSearchLimitToDirectories : FindExSearchNameMatch, NULL, 0);
    if(findFile == INVALID_HANDLE_VALUE)
      return false;
  }
  bufferedEntry = true;
  return true;
#else
  if(dp)
  {
    errno = EINVAL;
    return false;
  }

  this->dirsOnly = dirsOnly;
  this->dirpath = dirpath;
  this->pattern = pattern;

  dp = opendir(dirpath.isEmpty() ? "." : (const char*)dirpath);
  return dp != 0;
#endif
}